

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.h
# Opt level: O2

SOccQuery * __thiscall
irr::video::CNullDriver::SOccQuery::operator=(SOccQuery *this,SOccQuery *other)

{
  ISceneNode *pIVar1;
  IMesh *pIVar2;
  u32 uVar3;
  
  pIVar1 = other->Node;
  this->Node = pIVar1;
  pIVar2 = other->Mesh;
  this->Mesh = pIVar2;
  this->field_2 = other->field_2;
  uVar3 = other->Run;
  this->Result = other->Result;
  this->Run = uVar3;
  if (pIVar1 != (ISceneNode *)0x0) {
    *(int *)(pIVar1->_vptr_ISceneNode[-3] + -0x20 + (long)(pIVar1->AbsoluteTransformation).M) =
         *(int *)(pIVar1->_vptr_ISceneNode[-3] + -0x20 + (long)(pIVar1->AbsoluteTransformation).M) +
         1;
  }
  if (pIVar2 != (IMesh *)0x0) {
    *(int *)(&pIVar2->field_0x10 + (long)pIVar2->_vptr_IMesh[-3]) =
         *(int *)(&pIVar2->field_0x10 + (long)pIVar2->_vptr_IMesh[-3]) + 1;
  }
  return this;
}

Assistant:

SOccQuery &operator=(const SOccQuery &other)
		{
			Node = other.Node;
			Mesh = other.Mesh;
			PID = other.PID;
			Result = other.Result;
			Run = other.Run;
			if (Node)
				Node->grab();
			if (Mesh)
				Mesh->grab();
			return *this;
		}